

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  SPxId enterCoId;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined6 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabe;
  undefined1 in_stack_fffffffffffffabf;
  byte bVar5;
  undefined8 local_530;
  undefined1 local_528 [56];
  undefined1 local_4f0 [48];
  double in_stack_fffffffffffffb40;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffb48;
  DataKey local_480;
  undefined1 local_478 [56];
  undefined1 local_440 [56];
  DataKey local_408;
  undefined1 local_400 [40];
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc48;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc50;
  DataKey local_390;
  undefined1 local_388 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcb0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcb8;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcc0;
  DataKey local_318;
  undefined1 local_310 [56];
  undefined1 local_2d8 [56];
  DataKey local_2a0;
  undefined1 local_298 [40];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd98;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffda0;
  DataKey local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined4 local_20c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  undefined1 local_1d0 [56];
  DataKey local_198;
  DataKey local_190 [3];
  DataKey local_178;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined4 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined4 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_128;
  undefined1 *local_118;
  undefined1 *local_108;
  undefined1 *local_f8;
  undefined1 *local_e8;
  undefined1 *local_d8;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined8 *local_70;
  long local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  long local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxId::SPxId((SPxId *)0x3ae8f6);
  SPxId::SPxId((SPxId *)0x3ae903);
  local_170 = local_1d0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_168 = &local_208;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_20c = 0;
  local_148 = local_1d0;
  local_150 = &local_20c;
  local_80 = local_150;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_RSI,CONCAT17(in_stack_fffffffffffffabf,
                             CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
  local_210 = 0;
  local_158 = &local_208;
  local_160 = &local_210;
  local_78 = local_160;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_RSI,CONCAT17(in_stack_fffffffffffffabf,
                             CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
  local_218 = 0x3ff0000000000000;
  local_50 = in_RDI + 0x68;
  local_58 = &local_218;
  local_48 = local_58;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  local_220 = 0x3ff0000000000000;
  local_68 = in_RDI + 0x68;
  local_70 = &local_220;
  local_60 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd2c) & 1) == 0) ||
     ((*(byte *)(in_RDI + 0x110) & 1) != 0)) {
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd29) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x110) & 1) != 0)) {
      local_a8 = local_478;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_408 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffc40,
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffc3c,
                                                           in_stack_fffffffffffffc38),
                                               in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                                               in_stack_fffffffffffffc28);
    }
    else {
      local_b8 = local_440;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_408 = (DataKey)selectEnterSparseDim
                                     (in_stack_fffffffffffffc40,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                      in_stack_fffffffffffffc30);
    }
    local_198 = local_408;
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd2a) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x110) & 1) != 0)) {
      local_88 = local_4f0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_480 = (DataKey)selectEnterDenseCoDim
                                     (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                                      in_stack_fffffffffffffc38);
    }
    else {
      local_98 = &stack0xfffffffffffffb48;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_480 = (DataKey)selectEnterSparseCoDim
                                     (in_stack_fffffffffffffc40,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                      in_stack_fffffffffffffc30);
    }
    local_190[0] = local_480;
    goto LAB_003af048;
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xd0));
  if (iVar3 < 2) {
LAB_003aeaf6:
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd29) & 1) == 0) {
      local_128 = local_298;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_228 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffc40,
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffc3c,
                                                           in_stack_fffffffffffffc38),
                                               in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                                               in_stack_fffffffffffffc28);
    }
    else {
      local_138 = &stack0xfffffffffffffda0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_228 = (DataKey)buildBestPriceVectorEnterDim
                                     (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                                      in_stack_fffffffffffffcb0);
    }
    local_198 = local_228;
  }
  else {
    pSVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lastUpdate(pSVar4);
    if (iVar3 == 0) goto LAB_003aeaf6;
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd29) & 1) == 0) {
      local_108 = local_310;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_2a0 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffc40,
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_fffffffffffffc3c,
                                                           in_stack_fffffffffffffc38),
                                               in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                                               in_stack_fffffffffffffc28);
    }
    else {
      local_118 = local_2d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT17(in_stack_fffffffffffffabf,
                                 CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
      local_2a0 = (DataKey)selectEnterHyperDim(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                               in_stack_fffffffffffffd90);
    }
    local_198 = local_2a0;
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xf0));
  if (1 < iVar3) {
    pSVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lastUpdate(pSVar4);
    if (iVar3 != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd2a) & 1) == 0) {
        local_c8 = local_400;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT17(in_stack_fffffffffffffabf,
                                   CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
        local_390 = (DataKey)selectEnterDenseCoDim
                                       (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                                        in_stack_fffffffffffffc38);
      }
      else {
        local_d8 = &stack0xfffffffffffffc38;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT17(in_stack_fffffffffffffabf,
                                   CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
        local_390 = (DataKey)selectEnterHyperCoDim
                                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                        in_stack_fffffffffffffd90);
      }
      local_190[0] = local_390;
      goto LAB_003af048;
    }
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0xd2a) & 1) == 0) {
    local_e8 = local_388;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT17(in_stack_fffffffffffffabf,
                               CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
    local_318 = (DataKey)selectEnterDenseCoDim
                                   (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                                    in_stack_fffffffffffffc38);
  }
  else {
    local_f8 = &stack0xfffffffffffffcb0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT17(in_stack_fffffffffffffabf,
                               CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)));
    local_318 = (DataKey)buildBestPriceVectorEnterCoDim
                                   (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                                    in_stack_fffffffffffffcb0);
  }
  local_190[0] = local_318;
LAB_003af048:
  bVar1 = SPxId::isValid((SPxId *)&local_198);
  bVar5 = 0;
  if (bVar1) {
    local_530 = 0x3fe999999999999a;
    local_28 = local_528;
    local_30 = &local_530;
    local_38 = &local_208;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_528;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
    local_10 = local_528;
    local_18 = local_38;
    local_8 = local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (in_RSI,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8)),
               (double *)0x3af118);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffabe,
                                                  in_stack_fffffffffffffab8)),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3af12a);
    bVar5 = 1;
    if (!tVar2) {
      bVar1 = SPxId::isValid((SPxId *)local_190);
      bVar5 = bVar1 ^ 0xff;
    }
  }
  if ((bVar5 & 1) == 0) {
    local_178 = local_190[0];
  }
  else {
    local_178 = local_198;
  }
  return (SPxId)local_178;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}